

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_CNT_r(DisasContext_conflict1 *s,arg_CNT_r *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint uVar2;
  TCGv_i64 ret;
  uint numelem;
  uint fullsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_CNT_r *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    uVar2 = vec_full_reg_size(s);
    uVar2 = decode_pred_count(uVar2,a->pat,a->esz);
    ret = cpu_reg_aarch64(s,a->rd);
    tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret,(ulong)(uVar2 * a->imm));
  }
  return true;
}

Assistant:

static bool trans_CNT_r(DisasContext *s, arg_CNT_r *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned fullsz = vec_full_reg_size(s);
        unsigned numelem = decode_pred_count(fullsz, a->pat, a->esz);
        tcg_gen_movi_i64(tcg_ctx, cpu_reg(s, a->rd), numelem * a->imm);
    }
    return true;
}